

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

string * showVec_abi_cxx11_(string *__return_storage_ptr__,vec<int> *v)

{
  uint i;
  ulong uVar1;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  for (uVar1 = 0; uVar1 < v->sz; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(local_1a0," ");
    }
    std::ostream::operator<<((ostream *)local_1a0,v->data[uVar1]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string showVec(const vec<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}